

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

exr_result_t
extract_chunk_leader
          (_internal_exr_context *ctxt,_internal_exr_part *part,int partnum,uint64_t offset,
          uint64_t *next_offset,priv_chunk_leader *leaderdata)

{
  uint8_t uVar1;
  exr_storage_t eVar2;
  exr_result_t eVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int32_t data [6];
  uint64_t local_60;
  int local_58 [8];
  uint64_t *local_38;
  
  lVar8 = 0x7fffffff;
  if (0 < ctxt->file_size) {
    lVar8 = ctxt->file_size;
  }
  eVar2 = part->storage_mode;
  if (eVar2 == EXR_STORAGE_SCANLINE) {
LAB_00122d58:
    lVar7 = ((ulong)(eVar2 != EXR_STORAGE_DEEP_SCANLINE) - (ulong)(ctxt->is_multipart == '\0')) + 2;
  }
  else {
    if (eVar2 == EXR_STORAGE_DEEP_TILED) {
      uVar1 = ctxt->is_multipart;
      lVar7 = 5;
    }
    else {
      if (eVar2 == EXR_STORAGE_DEEP_SCANLINE) goto LAB_00122d58;
      uVar1 = ctxt->is_multipart;
      lVar7 = 6;
    }
    lVar7 = lVar7 - (ulong)(uVar1 == '\0');
  }
  local_60 = offset;
  local_38 = next_offset;
  eVar3 = (*ctxt->do_read)(ctxt,local_58,lVar7 << 2,&local_60,(int64_t *)0x0,EXR_MUST_READ_ALL);
  if (eVar3 == 0) {
    uVar4 = 0;
    iVar9 = 0;
    if ((ctxt->is_multipart == '\0') || (uVar4 = 1, iVar9 = partnum, local_58[0] == partnum)) {
      leaderdata->partnum = iVar9;
      lVar7 = 4;
      uVar5 = uVar4;
      if ((part->storage_mode & ~EXR_STORAGE_DEEP_SCANLINE) != EXR_STORAGE_SCANLINE) {
        *(undefined8 *)&leaderdata->field_1 = *(undefined8 *)(local_58 + uVar4);
        uVar5 = uVar4 + 3;
        (leaderdata->field_1).field_1.level_x = local_58[(ulong)uVar4 + 2];
        lVar7 = 0x10;
      }
      *(int *)((long)&leaderdata->partnum + lVar7) = local_58[uVar5];
      if ((part->storage_mode & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) {
        eVar3 = (*ctxt->do_read)(ctxt,&leaderdata->field_2,0x18,&local_60,(int64_t *)0x0,
                                 EXR_MUST_READ_ALL);
        if (eVar3 != 0) {
          return eVar3;
        }
        uVar6 = (leaderdata->field_2).deep_data[1];
        if (lVar8 < (long)uVar6 || (long)uVar6 < 0) {
          eVar3 = (*ctxt->print_error)
                            (ctxt,0x16,
                             "Invalid chunk size reconstructing chunk table: found out of range %ld"
                             ,uVar6);
          return eVar3;
        }
        leaderdata->packed_size = uVar6;
        local_60 = local_60 + uVar6;
      }
      else {
        uVar6 = (uint64_t)local_58[(ulong)uVar5 + 1];
        if (((long)uVar6 < 0) || (lVar8 < (long)uVar6)) {
          eVar3 = (*ctxt->print_error)
                            (ctxt,0x16,
                             "Invalid chunk size reconstructing chunk table: found out of range %d")
          ;
          return eVar3;
        }
        leaderdata->packed_size = uVar6;
        local_60 = uVar6 + local_60;
      }
      *local_38 = local_60;
      eVar3 = 0;
    }
    else {
      eVar3 = (*ctxt->print_error)
                        (ctxt,0x16,
                         "Invalid part number reconstructing chunk table: expect %d, found %d",
                         (ulong)(uint)partnum);
    }
  }
  return eVar3;
}

Assistant:

static exr_result_t
extract_chunk_leader (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    int                                 partnum,
    uint64_t                            offset,
    uint64_t*                           next_offset,
    struct priv_chunk_leader*           leaderdata)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    int32_t      data[6];
    uint64_t     nextoffset = offset;
    int          rdcnt, ntoread;
    int64_t      maxval = (int64_t) INT_MAX; // 2GB

    if (ctxt->file_size > 0) maxval = ctxt->file_size;

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        ntoread = (ctxt->is_multipart) ? 2 : 1;
        if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) ++ntoread;
    }
    else if (part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (ctxt->is_multipart)
            ntoread = 5;
        else
            ntoread = 4;
    }
    else if (ctxt->is_multipart)
        ntoread = 6;
    else
        ntoread = 5;

    rv = ctxt->do_read (
        ctxt,
        data,
        ntoread * sizeof (int32_t),
        &nextoffset,
        NULL,
        EXR_MUST_READ_ALL);
    if (rv != EXR_ERR_SUCCESS) return rv;

    priv_to_native32 (data, ntoread);

    rdcnt = 0;
    if (ctxt->is_multipart)
    {
        if (data[rdcnt] != partnum)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid part number reconstructing chunk table: expect %d, found %d",
                partnum,
                data[rdcnt]);
        }
        leaderdata->partnum = partnum;
        ++rdcnt;
    }
    else
        leaderdata->partnum = 0;

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        leaderdata->scanline_y = data[rdcnt];
    }
    else
    {
        leaderdata->tile_x  = data[rdcnt++];
        leaderdata->tile_y  = data[rdcnt++];
        leaderdata->level_x = data[rdcnt++];
        leaderdata->level_y = data[rdcnt];
    }

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        rv = ctxt->do_read (
            ctxt,
            leaderdata->deep_data,
            3 * sizeof (int64_t),
            &nextoffset,
            NULL,
            EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS) return rv;
        priv_to_native64 (leaderdata->deep_data, 3);

        if (leaderdata->deep_data[1] < 0 || leaderdata->deep_data[1] > maxval)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid chunk size reconstructing chunk table: found out of range %" PRId64,
                leaderdata->deep_data[1]);
        }
        leaderdata->packed_size = leaderdata->deep_packed_size;
        nextoffset += leaderdata->deep_packed_size;
    }
    else
    {
        ++rdcnt;

        if (data[rdcnt] < 0 || data[rdcnt] > maxval)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid chunk size reconstructing chunk table: found out of range %d",
                data[rdcnt]);
        }
        leaderdata->packed_size = (uint64_t) data[rdcnt];
        nextoffset += leaderdata->packed_size;
    }

    *next_offset = nextoffset;
    return rv;
}